

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_uncheckedSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t slotIndex;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar1 = *arguments;
  slotIndex = sysbvm_tuple_anySize_decode(arguments[1]);
  sVar1 = sysbvm_tuple_uncheckedSlotAt(context,sVar1,slotIndex);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_uncheckedSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    return sysbvm_tuple_uncheckedSlotAt(context, arguments[0], sysbvm_tuple_anySize_decode(arguments[1]));
}